

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int num_keys_cmp(void *p1,void *p2,void *opaque)

{
  JSAtom atom;
  uint uVar1;
  undefined8 in_RAX;
  uint32_t v2;
  uint32_t v1;
  undefined8 local_28;
  
  atom = *(JSAtom *)((long)p2 + 4);
  local_28 = in_RAX;
  JS_AtomIsArrayIndex((JSContext *)opaque,(uint32_t *)((long)&local_28 + 4),
                      *(JSAtom *)((long)p1 + 4));
  JS_AtomIsArrayIndex((JSContext *)opaque,(uint32_t *)&local_28,atom);
  uVar1 = 0xffffffff;
  if ((uint)local_28 <= local_28._4_4_) {
    uVar1 = (uint)(local_28._4_4_ != (uint)local_28);
  }
  return uVar1;
}

Assistant:

static int num_keys_cmp(const void *p1, const void *p2, void *opaque)
{
    JSContext *ctx = opaque;
    JSAtom atom1 = ((const JSPropertyEnum *)p1)->atom;
    JSAtom atom2 = ((const JSPropertyEnum *)p2)->atom;
    uint32_t v1, v2;
    BOOL atom1_is_integer, atom2_is_integer;

    atom1_is_integer = JS_AtomIsArrayIndex(ctx, &v1, atom1);
    atom2_is_integer = JS_AtomIsArrayIndex(ctx, &v2, atom2);
    assert(atom1_is_integer && atom2_is_integer);
    if (v1 < v2)
        return -1;
    else if (v1 == v2)
        return 0;
    else
        return 1;
}